

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_text.c
# Opt level: O0

void gatom_bang(t_gatom *x)

{
  int argc_00;
  t_atom *ptVar1;
  t_atom *argv;
  int i;
  int argc;
  t_atom *ap;
  t_gatom *x_local;
  
  ptVar1 = gatom_getatom(x);
  if (x->a_flavor == 1) {
    if ((x->a_text).te_outlet != (_outlet *)0x0) {
      outlet_float((x->a_text).te_outlet,(ptVar1->a_w).w_float);
    }
    if ((*x->a_expanded_to->s_name != '\0') && (x->a_expanded_to->s_thing != (_class **)0x0)) {
      if (x->a_symto == x->a_symfrom) {
        pd_error(x,"%s: atom with same send/receive name (infinite loop)",x->a_symto->s_name);
      }
      else {
        pd_float(x->a_expanded_to->s_thing,(ptVar1->a_w).w_float);
      }
    }
  }
  else if (x->a_flavor == 2) {
    if ((x->a_text).te_outlet != (_outlet *)0x0) {
      outlet_symbol((x->a_text).te_outlet,(ptVar1->a_w).w_symbol);
    }
    if ((*x->a_symto->s_name != '\0') && (x->a_expanded_to->s_thing != (_class **)0x0)) {
      if (x->a_symto == x->a_symfrom) {
        pd_error(x,"%s: atom with same send/receive name (infinite loop)",x->a_symto->s_name);
      }
      else {
        pd_symbol(x->a_expanded_to->s_thing,(ptVar1->a_w).w_symbol);
      }
    }
  }
  else {
    argc_00 = binbuf_getnatom((x->a_text).te_binbuf);
    ptVar1 = binbuf_getvec((x->a_text).te_binbuf);
    for (argv._0_4_ = 0; (int)argv < argc_00; argv._0_4_ = (int)argv + 1) {
      if ((ptVar1[(int)argv].a_type != A_FLOAT) && (ptVar1[(int)argv].a_type != A_SYMBOL)) {
        pd_error(x,"list: only sends literal numbers and symbols");
        return;
      }
    }
    if ((x->a_text).te_outlet != (_outlet *)0x0) {
      outlet_list((x->a_text).te_outlet,&s_list,argc_00,ptVar1);
    }
    if ((*x->a_expanded_to->s_name != '\0') && (x->a_expanded_to->s_thing != (_class **)0x0)) {
      if (x->a_symto == x->a_symfrom) {
        pd_error(x,"%s: atom with same send/receive name (infinite loop)",x->a_symto->s_name);
      }
      else {
        pd_list(x->a_expanded_to->s_thing,&s_list,argc_00,ptVar1);
      }
    }
  }
  return;
}

Assistant:

static void gatom_bang(t_gatom *x)
{
    t_atom *ap = gatom_getatom(x);
    if (x->a_flavor == A_FLOAT)
    {
        if (x->a_text.te_outlet)
            outlet_float(x->a_text.te_outlet, ap->a_w.w_float);
        if (*x->a_expanded_to->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_float(x->a_expanded_to->s_thing, ap->a_w.w_float);
        }
    }
    else if (x->a_flavor == A_SYMBOL)
    {
        if (x->a_text.te_outlet)
            outlet_symbol(x->a_text.te_outlet, ap->a_w.w_symbol);
        if (*x->a_symto->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_symbol(x->a_expanded_to->s_thing, ap->a_w.w_symbol);
        }
    }
    else    /* list */
    {
        int argc = binbuf_getnatom(x->a_text.te_binbuf), i;
        t_atom *argv = binbuf_getvec(x->a_text.te_binbuf);
        for (i = 0; i < argc; i++)
            if (argv[i].a_type != A_FLOAT && argv[i].a_type != A_SYMBOL)
        {
            pd_error(x, "list: only sends literal numbers and symbols");
            return;
        }
        if (x->a_text.te_outlet)
            outlet_list(x->a_text.te_outlet, &s_list, argc, argv);
        if (*x->a_expanded_to->s_name && x->a_expanded_to->s_thing)
        {
            if (x->a_symto == x->a_symfrom)
                pd_error(x,
                    "%s: atom with same send/receive name (infinite loop)",
                        x->a_symto->s_name);
            else pd_list(x->a_expanded_to->s_thing, &s_list, argc, argv);
        }
    }
}